

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

u16string *
anon_unknown.dwarf_eb88::cpputf8_u32_to_u16(u16string *__return_storage_ptr__,u32string *u32)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  in_RCX;
  long lVar4;
  string u8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  result.container = &local_48;
  paVar1 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  sVar2 = u32->_M_string_length;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  if (sVar2 != 0) {
    pcVar3 = (u32->_M_dataplus)._M_p;
    lVar4 = 0;
    do {
      result = utf8::append<std::back_insert_iterator<std::__cxx11::string>>
                         (*(uint32_t *)((long)pcVar3 + lVar4),result);
      lVar4 = lVar4 + 4;
    } while (sVar2 << 2 != lVar4);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  utf8::
  utf8to16<std::back_insert_iterator<std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((utf8 *)local_48._M_dataplus._M_p,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_48._M_dataplus._M_p + local_48._M_string_length),
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline
u16string cpputf8_u32_to_u16(const u32string& u32)
{
    // As above, we need to do this in two steps
    const string u8 = cpputf8_u32_to_u8(u32);
    return cpputf8_u8_to_u16(u8);
}